

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.h
# Opt level: O2

uint64_t __thiscall
bloaty::dwarf::CompilationUnitSizes::ReadAddress(CompilationUnitSizes *this,string_view *data)

{
  uint uVar1;
  unsigned_long uVar2;
  
  if (this->addr8_ == true) {
    uVar2 = ReadFixed<unsigned_long,8ul>(data);
    return uVar2;
  }
  uVar1 = ReadFixed<unsigned_int,4ul>(data);
  return (ulong)uVar1;
}

Assistant:

uint64_t ReadAddress(std::string_view* data) const {
    return addr8_ ? ReadFixed<uint64_t>(data) : ReadFixed<uint32_t>(data);
  }